

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O3

void __thiscall
xLearn::MODEL_TEST_SerializeToTXT_Test::TestBody(MODEL_TEST_SerializeToTXT_Test *this)

{
  string *score_func;
  string *loss_func;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Model model_ffm;
  Model model_fm;
  Model model_lr;
  HyperParam hyper_param;
  string local_3f8;
  Model local_3d8;
  Model local_348;
  Model local_2b8;
  HyperParam local_228;
  
  Init();
  score_func = &local_228.score_func;
  std::__cxx11::string::_M_replace
            ((ulong)score_func,0,(char *)local_228.score_func._M_string_length,0x1415fe);
  local_2b8.score_func_._M_dataplus._M_p = (pointer)&local_2b8.score_func_.field_2;
  loss_func = &local_228.loss_func;
  local_2b8.score_func_._M_string_length = 0;
  local_2b8.score_func_.field_2._M_local_buf[0] = '\0';
  local_2b8.loss_func_._M_dataplus._M_p = (pointer)&local_2b8.loss_func_.field_2;
  local_2b8.loss_func_._M_string_length = 0;
  local_2b8.loss_func_.field_2._M_local_buf[0] = '\0';
  local_2b8.param_w_ = (real_t *)0x0;
  local_2b8.param_v_ = (real_t *)0x0;
  local_2b8.param_b_ = (real_t *)0x0;
  local_2b8.param_best_w_ = (real_t *)0x0;
  local_2b8.param_best_v_ = (real_t *)0x0;
  local_2b8.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_2b8,score_func,loss_func,local_228.num_feature,local_228.num_field,
                    local_228.num_K,local_228.auxiliary_size,0.5);
  paVar1 = &local_348.score_func_.field_2;
  local_348.score_func_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"test_txt.linear","");
  Model::SerializeToTXT(&local_2b8,&local_348.score_func_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.score_func_._M_dataplus._M_p != paVar1) {
    operator_delete(local_348.score_func_._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_replace
            ((ulong)score_func,0,(char *)local_228.score_func._M_string_length,0x14160e);
  local_348.loss_func_._M_dataplus._M_p = (pointer)&local_348.loss_func_.field_2;
  local_348.score_func_._M_string_length = 0;
  local_348.score_func_.field_2._M_local_buf[0] = '\0';
  local_348.loss_func_._M_string_length = 0;
  local_348.loss_func_.field_2._M_local_buf[0] = '\0';
  local_348.param_w_ = (real_t *)0x0;
  local_348.param_v_ = (real_t *)0x0;
  local_348.param_b_ = (real_t *)0x0;
  local_348.param_best_w_ = (real_t *)0x0;
  local_348.param_best_v_ = (real_t *)0x0;
  local_348.param_best_b_ = (real_t *)0x0;
  local_348.score_func_._M_dataplus._M_p = (pointer)paVar1;
  Model::Initialize(&local_348,score_func,loss_func,local_228.num_feature,local_228.num_field,
                    local_228.num_K,local_228.auxiliary_size,0.5);
  paVar1 = &local_3d8.score_func_.field_2;
  local_3d8.score_func_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"test_txt.fm","");
  Model::SerializeToTXT(&local_348,&local_3d8.score_func_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.score_func_._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d8.score_func_._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_replace
            ((ulong)score_func,0,(char *)local_228.score_func._M_string_length,0x14161a);
  local_3d8.loss_func_._M_dataplus._M_p = (pointer)&local_3d8.loss_func_.field_2;
  local_3d8.score_func_._M_string_length = 0;
  local_3d8.score_func_.field_2._M_local_buf[0] = '\0';
  local_3d8.loss_func_._M_string_length = 0;
  local_3d8.loss_func_.field_2._M_local_buf[0] = '\0';
  local_3d8.param_w_ = (real_t *)0x0;
  local_3d8.param_v_ = (real_t *)0x0;
  local_3d8.param_b_ = (real_t *)0x0;
  local_3d8.param_best_w_ = (real_t *)0x0;
  local_3d8.param_best_v_ = (real_t *)0x0;
  local_3d8.param_best_b_ = (real_t *)0x0;
  local_3d8.score_func_._M_dataplus._M_p = (pointer)paVar1;
  Model::Initialize(&local_3d8,score_func,loss_func,local_228.num_feature,local_228.num_field,
                    local_228.num_K,local_228.auxiliary_size,0.5);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"test_txt.ffm","");
  Model::SerializeToTXT(&local_3d8,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  Model::~Model(&local_3d8);
  Model::~Model(&local_348);
  Model::~Model(&local_2b8);
  HyperParam::~HyperParam(&local_228);
  return;
}

Assistant:

TEST(MODEL_TEST, SerializeToTXT) {
  HyperParam hyper_param = Init();
  // linear
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_lr.SerializeToTXT("test_txt.linear");
  // fm
  hyper_param.score_func = "fm";
  Model model_fm;
  model_fm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_fm.SerializeToTXT("test_txt.fm");
  // ffm
  hyper_param.score_func = "ffm";
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_ffm.SerializeToTXT("test_txt.ffm");
}